

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void relativePointerHandleRelativeMotion
               (void *userData,zwp_relative_pointer_v1 *pointer,uint32_t timeHi,uint32_t timeLo,
               wl_fixed_t dx,wl_fixed_t dy,wl_fixed_t dxUnaccel,wl_fixed_t dyUnaccel)

{
  if (*(int *)((long)userData + 0x8c) != 0x34003) {
    return;
  }
  if (*(int *)((long)userData + 0x208) != 0) {
    dy = dyUnaccel;
    dx = dxUnaccel;
  }
  _glfwInputCursorPos((_GLFWwindow *)userData,
                      (double)((long)dx + 0x42b8000000000000) + -26388279066624.0 +
                      *(double *)((long)userData + 0x1f8),
                      (double)((long)dy + 0x42b8000000000000) + -26388279066624.0 +
                      *(double *)((long)userData + 0x200));
  return;
}

Assistant:

static void relativePointerHandleRelativeMotion(void* userData,
                                                struct zwp_relative_pointer_v1* pointer,
                                                uint32_t timeHi,
                                                uint32_t timeLo,
                                                wl_fixed_t dx,
                                                wl_fixed_t dy,
                                                wl_fixed_t dxUnaccel,
                                                wl_fixed_t dyUnaccel)
{
    _GLFWwindow* window = userData;
    double xpos = window->virtualCursorPosX;
    double ypos = window->virtualCursorPosY;

    if (window->cursorMode != GLFW_CURSOR_DISABLED)
        return;

    if (window->rawMouseMotion)
    {
        xpos += wl_fixed_to_double(dxUnaccel);
        ypos += wl_fixed_to_double(dyUnaccel);
    }
    else
    {
        xpos += wl_fixed_to_double(dx);
        ypos += wl_fixed_to_double(dy);
    }

    _glfwInputCursorPos(window, xpos, ypos);
}